

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::InputLess<tcu::Vector<float,_2>_>::operator()
          (InputLess<tcu::Vector<float,_2>_> *this,Vector<float,_2> *vec1,Vector<float,_2> *vec2)

{
  ulong uVar1;
  byte in_CL;
  
  for (uVar1 = 0; uVar1 != 2; uVar1 = uVar1 + 1) {
    in_CL = 1;
    if (vec1->m_data[uVar1] < vec2->m_data[uVar1]) break;
    in_CL = 0;
    if (vec2->m_data[uVar1] < vec1->m_data[uVar1]) break;
    in_CL = 0;
  }
  return (bool)(uVar1 < 2 & in_CL);
}

Assistant:

bool operator() (const Vector<T, Size>& vec1, const Vector<T, Size>& vec2) const
	{
		for (int ndx = 0; ndx < Size; ++ndx)
		{
			if (inputLess(vec1[ndx], vec2[ndx]))
				return true;
			if (inputLess(vec2[ndx], vec1[ndx]))
				return false;
		}

		return false;
	}